

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O1

int envy_bios_parse_power_cstep(envy_bios *bios)

{
  size_t __size;
  int iVar1;
  int iVar2;
  int iVar3;
  envy_bios_power_cstep_entry2 *peVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  byte bVar11;
  
  uVar6 = (bios->power).cstep.offset;
  iVar5 = -0x16;
  if ((ulong)uVar6 != 0) {
    if (uVar6 < bios->length) {
      (bios->power).cstep.version = bios->data[uVar6];
    }
    else {
      (bios->power).cstep.version = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    }
    if ((bios->power).cstep.version == '\x10') {
      uVar6 = (bios->power).cstep.offset + 1;
      if (uVar6 < bios->length) {
        (bios->power).cstep.hlen = bios->data[uVar6];
        iVar5 = 0;
      }
      else {
        (bios->power).cstep.hlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar5 = -0xe;
      }
      uVar6 = (bios->power).cstep.offset + 2;
      if (uVar6 < bios->length) {
        (bios->power).cstep.rlen = bios->data[uVar6];
        iVar7 = 0;
      }
      else {
        (bios->power).cstep.rlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar7 = -0xe;
      }
      uVar6 = (bios->power).cstep.offset + 3;
      if (uVar6 < bios->length) {
        (bios->power).cstep.entriesnum = bios->data[uVar6];
        iVar1 = 0;
      }
      else {
        (bios->power).cstep.entriesnum = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar1 = -0xe;
      }
      uVar6 = (bios->power).cstep.offset + 4;
      if (uVar6 < bios->length) {
        (bios->power).cstep.ssz = bios->data[uVar6];
        iVar2 = 0;
      }
      else {
        (bios->power).cstep.ssz = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar2 = -0xe;
      }
      uVar6 = (bios->power).cstep.offset + 5;
      if (uVar6 < bios->length) {
        (bios->power).cstep.snr = bios->data[uVar6];
        iVar3 = 0;
      }
      else {
        (bios->power).cstep.snr = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar3 = -0xe;
      }
      (bios->power).cstep.valid =
           (((iVar7 == 0 && iVar5 == 0) && iVar1 == 0) && iVar2 == 0) && iVar3 == 0;
      if (8 < (bios->power).cstep.entriesnum) {
        __assert_fail("cstep->entriesnum <= (sizeof(cstep->ent1) / sizeof(struct envy_bios_power_cstep_entry1))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/nvbios/power.c"
                      ,0x245,"int envy_bios_parse_power_cstep(struct envy_bios *)");
      }
      if ((bios->power).cstep.entriesnum != '\0') {
        uVar10 = 0;
        do {
          iVar5 = (uint)(bios->power).cstep.hlen + (bios->power).cstep.offset;
          iVar7 = (uint)(bios->power).cstep.rlen * (int)uVar10;
          uVar6 = iVar7 + iVar5 + 1;
          uVar8 = iVar5 + iVar7;
          if (uVar6 < bios->length) {
            bVar11 = (byte)(CONCAT11(bios->data[uVar6],bios->data[uVar8]) >> 5) & 0xf;
          }
          else {
            bVar11 = 0;
            fprintf(_stderr,"requested OOB u16 at 0x%04x\n",(ulong)uVar8);
          }
          (bios->power).cstep.ent1[uVar10].offset = uVar8;
          (bios->power).cstep.ent1[uVar10].pstate = bVar11;
          uVar8 = uVar8 + 3;
          if (uVar8 < bios->length) {
            (bios->power).cstep.ent1[uVar10].index = bios->data[uVar8];
          }
          else {
            (bios->power).cstep.ent1[uVar10].index = '\0';
            fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar8);
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 < (bios->power).cstep.entriesnum);
      }
      __size = (ulong)(bios->power).cstep.snr * 0xc;
      peVar4 = (envy_bios_power_cstep_entry2 *)malloc(__size);
      (bios->power).cstep.ent2 = peVar4;
      iVar5 = 0;
      memset(peVar4,0,__size);
      if ((bios->power).cstep.snr != '\0') {
        lVar9 = 0;
        uVar10 = 0;
        do {
          iVar7 = (uint)(bios->power).cstep.rlen * (uint)(bios->power).cstep.entriesnum +
                  (uint)(bios->power).cstep.hlen + (bios->power).cstep.offset;
          iVar5 = (uint)(bios->power).cstep.ssz * (int)uVar10;
          uVar6 = iVar7 + iVar5;
          peVar4 = (bios->power).cstep.ent2;
          *(uint *)(peVar4->unkn + lVar9 + -8) = uVar6;
          uVar8 = iVar5 + iVar7 + 1;
          if (uVar8 < bios->length) {
            *(ushort *)(peVar4->unkn + lVar9 + -2) = CONCAT11(bios->data[uVar8],bios->data[uVar6]);
          }
          else {
            (peVar4->unkn + lVar9 + -2)[0] = '\0';
            (peVar4->unkn + lVar9 + -2)[1] = '\0';
            fprintf(_stderr,"requested OOB u16 at 0x%04x\n",(ulong)uVar6);
          }
          peVar4 = (bios->power).cstep.ent2;
          if (uVar6 + 2 < bios->length) {
            peVar4->unkn[lVar9] = bios->data[uVar6 + 2];
          }
          else {
            peVar4->unkn[lVar9] = '\0';
            fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
          }
          peVar4 = (bios->power).cstep.ent2;
          if (uVar6 + 3 < bios->length) {
            peVar4->unkn[lVar9 + 1] = bios->data[uVar6 + 3];
          }
          else {
            peVar4->unkn[lVar9 + 1] = '\0';
            fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
          }
          uVar6 = uVar6 + 4;
          peVar4 = (bios->power).cstep.ent2;
          if (uVar6 < bios->length) {
            peVar4->unkn[lVar9 + 2] = bios->data[uVar6];
          }
          else {
            peVar4->unkn[lVar9 + 2] = '\0';
            fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar6);
          }
          peVar4 = (bios->power).cstep.ent2;
          peVar4->unkn[lVar9 + -4] = *(short *)(peVar4->unkn + lVar9 + -2) != 0;
          uVar10 = uVar10 + 1;
          lVar9 = lVar9 + 0xc;
        } while (uVar10 < (bios->power).cstep.snr);
        iVar5 = 0;
      }
    }
    else {
      fprintf(_stderr,"Unknown CSTEP table version 0x%x\n");
    }
  }
  return iVar5;
}

Assistant:

int envy_bios_parse_power_cstep(struct envy_bios *bios) {
	struct envy_bios_power_cstep *cstep = &bios->power.cstep;
	int i, err = 0;

	if (!cstep->offset)
		return -EINVAL;

	bios_u8(bios, cstep->offset + 0x0, &cstep->version);
	switch(cstep->version) {
	case 0x10:
		err |= bios_u8(bios, cstep->offset + 0x1, &cstep->hlen);
		err |= bios_u8(bios, cstep->offset + 0x2, &cstep->rlen);
		err |= bios_u8(bios, cstep->offset + 0x3, &cstep->entriesnum);
		err |= bios_u8(bios, cstep->offset + 0x4, &cstep->ssz);
		err |= bios_u8(bios, cstep->offset + 0x5, &cstep->snr);
		cstep->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown CSTEP table version 0x%x\n", cstep->version);
		return -EINVAL;
	};

	assert(cstep->entriesnum <= (sizeof(cstep->ent1) / sizeof(struct envy_bios_power_cstep_entry1)));
	for (i = 0; i < cstep->entriesnum; i++) {
		uint32_t data = cstep->offset + cstep->hlen + i * cstep->rlen;

		uint16_t tmp;
		err |= bios_u16(bios, data + 0x0, &tmp);

		cstep->ent1[i].offset = data;
		cstep->ent1[i].pstate = (tmp & 0x01e0) >> 5;
		bios_u8(bios, data + 0x3, &cstep->ent1[i].index);
	}

	cstep->ent2 = malloc(cstep->snr * sizeof(struct envy_bios_power_cstep_entry2));
	memset(cstep->ent2, 0x0, cstep->snr * sizeof(struct envy_bios_power_cstep_entry2));
	for (i = 0; i < cstep->snr; i++) {
		uint32_t data = cstep->offset + cstep->hlen + (cstep->entriesnum * cstep->rlen) + (i * cstep->ssz);

		cstep->ent2[i].offset = data;
		bios_u16(bios, data + 0x0, &cstep->ent2[i].freq);
		bios_u8(bios, data + 0x2, &cstep->ent2[i].unkn[0]);
		bios_u8(bios, data + 0x3, &cstep->ent2[i].unkn[1]);
		bios_u8(bios, data + 0x4, &cstep->ent2[i].voltage);
		cstep->ent2[i].valid = (cstep->ent2[i].freq > 0);
	}

	return 0;
}